

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.hpp
# Opt level: O2

void __thiscall
Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_void>::timer_counter
          (Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_void> *this)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> uStack_38;
  
  while (((this->m_running)._M_base._M_i & 1U) != 0) {
    std::unique_lock<std::mutex>::unique_lock(&uStack_38,&this->m_cycle_mutex);
    std::condition_variable::wait_for<long,std::ratio<1l,1l>>
              (&this->m_cond_cycle,&uStack_38,&this->m_cycle_time);
    if (((this->m_got_stopped)._M_base._M_i & 1U) == 0) {
      std::function<void_()>::operator()(&this->m_callable);
    }
    std::unique_lock<std::mutex>::~unique_lock(&uStack_38);
  }
  return;
}

Assistant:

void timer_counter() {

    while (m_running) {
      std::unique_lock lock(m_cycle_mutex);
      m_cond_cycle.wait_for(lock, m_cycle_time);
      if (!m_got_stopped){
        m_callable();
      }
    }
  }